

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

int MD5_Final(uchar *md,MD5_CTX *c)

{
  ulong uVar1;
  void *pvVar2;
  ulong local_28;
  size_t available;
  size_t used;
  MD5_CTX *ctx_local;
  uint8_t *result_local;
  
  uVar1 = (ulong)(c->A & 0x3f);
  available = uVar1 + 1;
  *(undefined1 *)((long)c->data + uVar1) = 0x80;
  local_28 = 0x40 - available;
  if (local_28 < 8) {
    memset((void *)((long)c->data + uVar1 + 1),0,local_28);
    body((MD5_CTX *)c,c->data,0x40);
    available = 0;
    local_28 = 0x40;
  }
  memset((void *)((long)c->data + available),0,local_28 - 8);
  c->A = c->A << 3;
  *(char *)(c->data + 0xe) = (char)c->A;
  *(char *)((long)c->data + 0x39) = (char)(c->A >> 8);
  *(char *)((long)c->data + 0x3a) = (char)(c->A >> 0x10);
  *(char *)((long)c->data + 0x3b) = (char)(c->A >> 0x18);
  *(char *)(c->data + 0xf) = (char)c->B;
  *(char *)((long)c->data + 0x3d) = (char)(c->B >> 8);
  *(char *)((long)c->data + 0x3e) = (char)(c->B >> 0x10);
  *(char *)((long)c->data + 0x3f) = (char)(c->B >> 0x18);
  body((MD5_CTX *)c,c->data,0x40);
  *md = (uchar)c->C;
  md[1] = (uchar)(c->C >> 8);
  md[2] = (uchar)(c->C >> 0x10);
  md[3] = (uchar)(c->C >> 0x18);
  md[4] = (uchar)c->D;
  md[5] = (uchar)(c->D >> 8);
  md[6] = (uchar)(c->D >> 0x10);
  md[7] = (uchar)(c->D >> 0x18);
  md[8] = (uchar)c->Nl;
  md[9] = (uchar)(c->Nl >> 8);
  md[10] = (uchar)(c->Nl >> 0x10);
  md[0xb] = (uchar)(c->Nl >> 0x18);
  md[0xc] = (uchar)c->Nh;
  md[0xd] = (uchar)(c->Nh >> 8);
  md[0xe] = (uchar)(c->Nh >> 0x10);
  md[0xf] = (uchar)(c->Nh >> 0x18);
  pvVar2 = memset(c,0,0x98);
  return (int)pvVar2;
}

Assistant:

void MD5_Final(uint8_t *result, MD5_CTX *ctx)
{
  size_t used, available;

  used = ctx->lo & 0x3f;

  ctx->buffer[used++] = 0x80;

  available = 64 - used;

  if (available < 8) {
    memset(&ctx->buffer[used], 0, available);
    body(ctx, ctx->buffer, 64);
    used = 0;
    available = 64;
  }

  memset(&ctx->buffer[used], 0, available - 8);

  ctx->lo <<= 3;
  ctx->buffer[56] = (uint8_t)ctx->lo;
  ctx->buffer[57] = (uint8_t)(ctx->lo >> 8);
  ctx->buffer[58] = (uint8_t)(ctx->lo >> 16);
  ctx->buffer[59] = (uint8_t)(ctx->lo >> 24);
  ctx->buffer[60] = (uint8_t)ctx->hi;
  ctx->buffer[61] = (uint8_t)(ctx->hi >> 8);
  ctx->buffer[62] = (uint8_t)(ctx->hi >> 16);
  ctx->buffer[63] = (uint8_t)(ctx->hi >> 24);

  body(ctx, ctx->buffer, 64);

  result[0] = (uint8_t)ctx->a;
  result[1] = (uint8_t)(ctx->a >> 8);
  result[2] = (uint8_t)(ctx->a >> 16);
  result[3] = (uint8_t)(ctx->a >> 24);
  result[4] = (uint8_t)ctx->b;
  result[5] = (uint8_t)(ctx->b >> 8);
  result[6] = (uint8_t)(ctx->b >> 16);
  result[7] = (uint8_t)(ctx->b >> 24);
  result[8] = (uint8_t)ctx->c;
  result[9] = (uint8_t)(ctx->c >> 8);
  result[10] = (uint8_t)(ctx->c >> 16);
  result[11] = (uint8_t)(ctx->c >> 24);
  result[12] = (uint8_t)ctx->d;
  result[13] = (uint8_t)(ctx->d >> 8);
  result[14] = (uint8_t)(ctx->d >> 16);
  result[15] = (uint8_t)(ctx->d >> 24);

  memset(ctx, 0, sizeof(*ctx));
}